

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

Node * __thiscall anon_unknown.dwarf_4153d9::Db::parseSourceName(Db *this,NameState *param_1)

{
  bool bVar1;
  Node *pNVar2;
  char *pcVar3;
  char *pcVar4;
  size_t Length;
  size_t local_20;
  
  local_20 = 0;
  bVar1 = parsePositiveInteger(this,&local_20);
  if ((!bVar1) && (pcVar3 = this->First, local_20 - 1 < (ulong)((long)this->Last - (long)pcVar3))) {
    pcVar4 = (char *)((long)pcVar3 + local_20);
    this->First = pcVar4;
    if ((9 < local_20) &&
       (*(short *)((long)pcVar3 + 8) == 0x4e5f &&
        *(_func_int **)pcVar3 == (_func_int *)0x5f4c41424f4c475f)) {
      pcVar4 = "";
      pcVar3 = "(anonymous namespace)";
    }
    pNVar2 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x20);
    pNVar2->K = KNameType;
    pNVar2->RHSComponentCache = No;
    pNVar2->ArrayCache = No;
    pNVar2->FunctionCache = No;
    pNVar2->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001e3700;
    pNVar2[1]._vptr_Node = (_func_int **)pcVar3;
    *(char **)&pNVar2[1].K = pcVar4;
    return pNVar2;
  }
  return (Node *)0x0;
}

Assistant:

Node *Db::parseSourceName(NameState *) {
  size_t Length = 0;
  if (parsePositiveInteger(&Length))
    return nullptr;
  if (numLeft() < Length || Length == 0)
    return nullptr;
  StringView Name(First, First + Length);
  First += Length;
  if (Name.startsWith("_GLOBAL__N"))
    return make<NameType>("(anonymous namespace)");
  return make<NameType>(Name);
}